

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall kj::HttpHeaders::add(HttpHeaders *this,String *name,String *value)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  StringPtr value_00;
  StringPtr name_00;
  
  sVar1 = (name->content).size_;
  pcVar2 = "";
  pcVar3 = "";
  if (sVar1 != 0) {
    pcVar3 = (name->content).ptr;
  }
  name_00.content.size_ = sVar1 + (sVar1 == 0);
  sVar1 = (value->content).size_;
  if (sVar1 != 0) {
    pcVar2 = (value->content).ptr;
  }
  value_00.content.size_ = sVar1 + (sVar1 == 0);
  value_00.content.ptr = pcVar2;
  name_00.content.ptr = pcVar3;
  add(this,name_00,value_00);
  takeOwnership(this,name);
  takeOwnership(this,value);
  return;
}

Assistant:

void HttpHeaders::add(kj::String&& name, kj::String&& value) {
  add(kj::StringPtr(name), kj::StringPtr(value));
  takeOwnership(kj::mv(name));
  takeOwnership(kj::mv(value));
}